

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall sptk::ScalarOperation::AddModuloOperation(ScalarOperation *this,double divisor)

{
  ModuleInterface *pMVar1;
  _func_int **pp_Var2;
  ModuleInterface *local_20;
  
  if ((divisor != 0.0) || (NAN(divisor))) {
    pMVar1 = (ModuleInterface *)operator_new(0x10);
    pp_Var2 = (_func_int **)operator_new(0x10);
    *pp_Var2 = (_func_int *)&PTR__OperationInterface_001145b0;
    pp_Var2[1] = (_func_int *)divisor;
    pMVar1->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001144b0;
    pMVar1[1]._vptr_ModuleInterface = pp_Var2;
    local_20 = pMVar1;
    std::
    vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
    ::emplace_back<sptk::ScalarOperation::ModuleInterface*>
              ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                *)&this->modules_,&local_20);
  }
  return (bool)(-(divisor != 0.0) & 1);
}

Assistant:

bool ScalarOperation::AddModuloOperation(double divisor) {
  if (0 == divisor) return false;
  modules_.push_back(new OperationPerformer(new Modulo(divisor)));
  return true;
}